

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

void gc_call_finalizer(global_State *g,lua_State *L,cTValue *mo,GCobj *o)

{
  byte *pbVar1;
  byte bVar2;
  GCSize GVar3;
  cTValue *pcVar4;
  int errcode;
  
  bVar2 = g->hookmask;
  GVar3 = (g->gc).threshold;
  pbVar1 = (byte *)((long)&g[1].tmptv + 4);
  *pbVar1 = *pbVar1 & 0xef;
  g->hookmask = bVar2 & 0x2f | 0x50;
  if ((char)bVar2 < '\0') {
    lj_dispatch_update(g);
  }
  (g->gc).threshold = 0x800000000000;
  pcVar4 = L->top;
  *pcVar4 = *mo;
  pcVar4[1].u64 = 0xffffffffffffffff;
  pcVar4[2].u64 = (ulong)~(uint)(o->gch).gct << 0x2f | (ulong)o;
  L->top = pcVar4 + 3;
  errcode = lj_vm_pcall(L,pcVar4 + 2,1,0xffffffffffffffff);
  g->hookmask = g->hookmask & 0xf | bVar2 & 0xf0;
  if ((char)bVar2 < '\0') {
    lj_dispatch_update(g);
  }
  (g->gc).threshold = GVar3;
  if (errcode == 0) {
    return;
  }
  lj_err_throw(L,errcode);
}

Assistant:

static void gc_call_finalizer(global_State *g, lua_State *L,
			      cTValue *mo, GCobj *o)
{
  /* Save and restore lots of state around the __gc callback. */
  uint8_t oldh = hook_save(g);
  GCSize oldt = g->gc.threshold;
  int errcode;
  TValue *top;
  lj_trace_abort(g);
  hook_entergc(g);  /* Disable hooks and new traces during __gc. */
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = LJ_MAX_MEM;  /* Prevent GC steps. */
  top = L->top;
  copyTV(L, top++, mo);
  if (LJ_FR2) setnilV(top++);
  setgcV(L, top, o, ~o->gch.gct);
  L->top = top+1;
  errcode = lj_vm_pcall(L, top, 1+0, -1);  /* Stack: |mo|o| -> | */
  hook_restore(g, oldh);
  if (LJ_HASPROFILE && (oldh & HOOK_PROFILE)) lj_dispatch_update(g);
  g->gc.threshold = oldt;  /* Restore GC threshold. */
  if (errcode)
    lj_err_throw(L, errcode);  /* Propagate errors. */
}